

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hand.h
# Opt level: O3

void __thiscall hand::sortHand(hand *this)

{
  pointer pcVar1;
  long lVar2;
  pointer pcVar3;
  pointer pcVar4;
  pointer pcVar5;
  vector<card,std::allocator<card>> *this_00;
  vector<card,std::allocator<card>> *this_01;
  ulong uVar6;
  vector<card,std::allocator<card>> *this_02;
  card *i;
  pointer pcVar7;
  __normal_iterator<card_*,_std::vector<card,_std::allocator<card>_>_> _Var8;
  __normal_iterator<card_*,_std::vector<card,_std::allocator<card>_>_> _Var9;
  unique_ptr<std::vector<card,_std::allocator<card>_>,_std::default_delete<std::vector<card,_std::allocator<card>_>_>_>
  regHand;
  
  this_00 = (vector<card,std::allocator<card>> *)operator_new(0x18);
  *(undefined8 *)this_00 = 0;
  *(undefined8 *)(this_00 + 8) = 0;
  *(undefined8 *)(this_00 + 0x10) = 0;
  this_01 = (vector<card,std::allocator<card>> *)operator_new(0x18);
  *(undefined8 *)this_01 = 0;
  *(undefined8 *)(this_01 + 8) = 0;
  *(undefined8 *)(this_01 + 0x10) = 0;
  pcVar7 = (this->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar1 = (this->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
           super__Vector_impl_data._M_finish;
  if (pcVar7 != pcVar1) {
    do {
      this_02 = this_00;
      if (pcVar7->cardType != 0) {
        this_02 = this_01;
      }
      std::vector<card,_std::allocator<card>_>::push_back
                ((vector<card,_std::allocator<card>_> *)this_02,pcVar7);
      pcVar7 = pcVar7 + 1;
    } while (pcVar7 != pcVar1);
    _Var9._M_current = *(card **)this_00;
    _Var8._M_current = *(card **)(this_00 + 8);
    if (_Var9._M_current != _Var8._M_current) {
      uVar6 = ((long)_Var8._M_current - (long)_Var9._M_current >> 4) * -0x5555555555555555;
      lVar2 = 0x3f;
      if (uVar6 != 0) {
        for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
        }
      }
      std::
      __introsort_loop<__gnu_cxx::__normal_iterator<card*,std::vector<card,std::allocator<card>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(card_const&,card_const&)>>
                (_Var9,_Var8,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
                 (_Iter_comp_iter<bool_(*)(const_card_&,_const_card_&)>)0x1028f8);
      std::
      __final_insertion_sort<__gnu_cxx::__normal_iterator<card*,std::vector<card,std::allocator<card>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(card_const&,card_const&)>>
                (_Var9,_Var8,(_Iter_comp_iter<bool_(*)(const_card_&,_const_card_&)>)0x1028f8);
    }
  }
  _Var9._M_current = *(card **)this_01;
  _Var8._M_current = *(card **)(this_01 + 8);
  if (_Var9._M_current != _Var8._M_current) {
    uVar6 = ((long)_Var8._M_current - (long)_Var9._M_current >> 4) * -0x5555555555555555;
    lVar2 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar2 == 0; lVar2 = lVar2 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<card*,std::vector<card,std::allocator<card>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(card_const&,card_const&)>>
              (_Var9,_Var8,(ulong)(((uint)lVar2 ^ 0x3f) * 2) ^ 0x7e,
               (_Iter_comp_iter<bool_(*)(const_card_&,_const_card_&)>)0x102902);
    std::
    __final_insertion_sort<__gnu_cxx::__normal_iterator<card*,std::vector<card,std::allocator<card>>>,__gnu_cxx::__ops::_Iter_comp_iter<bool(*)(card_const&,card_const&)>>
              (_Var9,_Var8,(_Iter_comp_iter<bool_(*)(const_card_&,_const_card_&)>)0x102902);
    _Var9._M_current = *(card **)this_01;
    _Var8._M_current = *(card **)(this_01 + 8);
  }
  std::vector<card,std::allocator<card>>::
  _M_range_insert<__gnu_cxx::__normal_iterator<card*,std::vector<card,std::allocator<card>>>>
            (this_00,*(undefined8 *)(this_00 + 8),_Var9._M_current,_Var8._M_current);
  pcVar7 = (this->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pcVar1 = *(pointer *)this_00;
  pcVar3 = *(pointer *)(this_00 + 8);
  (this->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = *(pointer *)(this_00 + 0x10);
  pcVar4 = (this->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
           super__Vector_impl_data._M_start;
  pcVar5 = (this->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (this->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.super__Vector_impl_data.
  _M_start = pcVar1;
  (this->hand_).super__Vector_base<card,_std::allocator<card>_>._M_impl.super__Vector_impl_data.
  _M_finish = pcVar3;
  *(pointer *)this_00 = pcVar4;
  *(pointer *)(this_00 + 8) = pcVar5;
  *(pointer *)(this_00 + 0x10) = pcVar7;
  std::vector<card,_std::allocator<card>_>::~vector((vector<card,_std::allocator<card>_> *)this_01);
  operator_delete(this_01);
  std::vector<card,_std::allocator<card>_>::~vector((vector<card,_std::allocator<card>_> *)this_00);
  operator_delete(this_00);
  return;
}

Assistant:

void hand::sortHand() {
    unique_ptr <vector<card>> regHand(new vector<card>);
    unique_ptr <vector<card>> specialHand(new vector<card>);
    for (auto &i : hand_) {
        if(isRegularCard(i))regHand->push_back(i);
        else specialHand->push_back(i);
    }
    sort(regHand->begin(),regHand->end(),sortByValue);
    sort(specialHand->begin(),specialHand->end(),sortByName);
    regHand->insert(regHand->end(),specialHand->begin(),specialHand->end());
    hand_.swap(*regHand);
}